

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celu.cpp
# Opt level: O2

int __thiscall ncnn::CELU::forward_inplace(CELU *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  void *pvVar5;
  int i;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  
  uVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
  pvVar5 = bottom_top_blob->data;
  sVar2 = bottom_top_blob->cstep;
  sVar3 = bottom_top_blob->elemsize;
  uVar4 = 0;
  uVar8 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar8 = uVar4;
  }
  uVar9 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar9 = uVar4;
  }
  for (; uVar4 != uVar9; uVar4 = uVar4 + 1) {
    for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      fVar10 = *(float *)((long)pvVar5 + uVar6 * 4);
      if (fVar10 < 0.0) {
        fVar1 = this->alpha;
        fVar10 = expf(fVar10 / fVar1);
        *(float *)((long)pvVar5 + uVar6 * 4) = (fVar10 + -1.0) * fVar1;
      }
    }
    pvVar5 = (void *)((long)pvVar5 + sVar2 * sVar3);
  }
  return 0;
}

Assistant:

int CELU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            if (ptr[i] < 0.f)
                ptr[i] = (expf(ptr[i] / alpha) - 1.f) * alpha;
        }
    }

    return 0;
}